

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O2

bool tinyusdz::ReadMaterialXFromFile
               (AssetResolutionResolver *resolver,string *asset_path,MtlxModel *mtlx,string *warn,
               string *err)

{
  bool bVar1;
  ostream *poVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string filepath;
  string str;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0 [11];
  
  AssetResolutionResolver::resolve(&local_1c0,resolver,asset_path);
  if (local_1c0._M_string_length == 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    poVar2 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadMaterialXFromFile");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x389);
    ::std::operator<<(poVar2," ");
    ::std::operator+(&local_1e0,"Asset not found: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)asset_path
                    );
    poVar2 = ::std::operator<<((ostream *)local_1a0,(string *)&local_1e0);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    bVar1 = false;
  }
  else {
    local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1f8,
                              err,&local_1c0,0x1000000,(void *)0x0);
    if (bVar1) {
      local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,local_1f8._M_impl.super__Vector_impl_data._M_start,
                 local_1f8._M_impl.super__Vector_impl_data._M_finish);
      bVar1 = ReadMaterialXFromString(local_1a0,asset_path,mtlx,warn,err);
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      poVar2 = ::std::operator<<((ostream *)local_1a0,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadMaterialXFromFile");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x392);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_1a0,"Read file failed.");
      ::std::operator<<(poVar2,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      bVar1 = false;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1f8);
  }
  ::std::__cxx11::string::_M_dispose();
  return bVar1;
}

Assistant:

bool ReadMaterialXFromFile(const AssetResolutionResolver &resolver,
                           const std::string &asset_path, MtlxModel *mtlx,
                           std::string *warn, std::string *err) {
  std::string filepath = resolver.resolve(asset_path);
  if (filepath.empty()) {
    PUSH_ERROR_AND_RETURN("Asset not found: " + asset_path);
  }

  // up to 16MB xml
  size_t max_bytes = 1024 * 1024 * 16;

  std::vector<uint8_t> data;
  if (!io::ReadWholeFile(&data, err, filepath, max_bytes,
                         /* userdata */ nullptr)) {
    PUSH_ERROR_AND_RETURN("Read file failed.");
  }

  std::string str(reinterpret_cast<const char *>(&data[0]), data.size());
  return ReadMaterialXFromString(str, asset_path, mtlx, warn, err);
}